

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O3

void __thiscall soul::heart::Assignment::visitExpressions(Assignment *this,ExpressionVisitorFn fn)

{
  Expression *pEVar1;
  pool_ref<soul::heart::Expression> ref;
  AccessType local_24;
  pool_ref<soul::heart::Expression> local_20;
  
  pEVar1 = (this->target).object;
  if (pEVar1 != (Expression *)0x0) {
    (*(pEVar1->super_Object)._vptr_Object[3])(pEVar1,fn,1);
    local_20.object = (this->target).object;
    if (local_20.object == (Expression *)0x0) {
      throwInternalCompilerError("object != nullptr","getAsPoolRef",0x3a);
    }
    local_24 = write;
    if ((fn->super__Function_base)._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*fn->_M_invoker)((_Any_data *)fn,&local_20,&local_24);
    (this->target).object = local_20.object;
  }
  return;
}

Assistant:

void visitExpressions (ExpressionVisitorFn fn) override
        {
            if (target != nullptr)
            {
                target->visitExpressions (fn, AccessType::write);
                auto ref = target.getAsPoolRef();
                fn (ref, AccessType::write);
                target = ref;
            }
        }